

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_api_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a078f1::EncodeAPI_Buganizer339877165_Test::TestBody
          (EncodeAPI_Buganizer339877165_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_51;
  AssertionResult gtest_ar_50;
  AssertionResult gtest_ar_49;
  AssertionResult gtest_ar_48;
  AssertionResult gtest_ar_47;
  aom_image_t *image;
  AssertionResult gtest_ar_46;
  aom_svc_ref_frame_config_t ref_frame_config;
  AssertionResult gtest_ar_45;
  aom_svc_layer_id_t layer_id;
  AssertionResult gtest_ar_44;
  aom_svc_params_t svc_params;
  AssertionResult gtest_ar_43;
  AssertionResult gtest_ar_42;
  AssertionResult gtest_ar_41;
  AssertionResult gtest_ar_40;
  AssertionResult gtest_ar_39;
  AssertionResult gtest_ar_38;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_36;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_ctx_t enc;
  aom_codec_iface_t *iface;
  aom_codec_ctx_t *in_stack_fffffffffffff028;
  AssertHelper *in_stack_fffffffffffff030;
  aom_codec_enc_cfg_t *in_stack_fffffffffffff038;
  aom_codec_iface_t *in_stack_fffffffffffff040;
  char *in_stack_fffffffffffff048;
  int line;
  aom_codec_enc_cfg_t *in_stack_fffffffffffff050;
  aom_image_t *in_stack_fffffffffffff058;
  Type type;
  aom_codec_ctx_t *in_stack_fffffffffffff060;
  Message *in_stack_fffffffffffff0a8;
  AssertHelper *in_stack_fffffffffffff0b0;
  AssertionResult local_e20 [2];
  undefined4 local_e00;
  aom_codec_err_t local_dfc;
  AssertionResult local_df8 [2];
  undefined4 local_dd8;
  aom_codec_err_t local_dd4;
  AssertionResult local_dd0 [2];
  undefined4 local_db0;
  aom_codec_err_t local_dac;
  AssertionResult local_da8 [2];
  undefined8 local_d88;
  AssertionResult local_d80;
  aom_image_t *local_d70;
  undefined4 local_d58;
  aom_codec_err_t local_d54;
  AssertionResult local_d50;
  undefined1 local_d40 [56];
  undefined4 local_d08;
  undefined4 local_cd8;
  aom_codec_err_t local_cd4;
  AssertionResult local_cd0;
  undefined4 local_cc0 [6];
  undefined4 local_ca8;
  aom_codec_err_t local_ca4;
  AssertionResult local_ca0;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined4 local_c88;
  undefined4 local_c84;
  undefined4 local_c08;
  undefined4 local_c04;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined4 local_b68;
  undefined4 local_ae8;
  undefined4 local_ab8;
  aom_codec_err_t local_ab4;
  AssertionResult local_ab0 [2];
  undefined4 local_a90;
  aom_codec_err_t local_a8c;
  AssertionResult local_a88 [2];
  undefined4 local_a68;
  aom_codec_err_t local_a64;
  AssertionResult local_a60 [2];
  undefined4 local_a40;
  aom_codec_err_t local_a3c;
  AssertionResult local_a38 [2];
  undefined4 local_a18;
  aom_codec_err_t local_a14;
  AssertionResult local_a10 [2];
  undefined4 local_9f0;
  aom_codec_err_t local_9ec;
  AssertionResult local_9e8 [2];
  undefined4 local_9c8;
  aom_codec_err_t local_9c4;
  AssertionResult local_9c0 [2];
  undefined4 local_9a0;
  aom_codec_err_t local_99c;
  AssertionResult local_998 [2];
  undefined4 local_978;
  aom_codec_err_t local_974;
  AssertionResult local_970 [2];
  undefined4 local_950;
  aom_codec_err_t local_94c;
  AssertionResult local_948 [2];
  undefined4 local_928;
  aom_codec_err_t local_924;
  AssertionResult local_920 [2];
  undefined4 local_900;
  aom_codec_err_t local_8fc;
  AssertionResult local_8f8 [2];
  undefined4 local_8d8;
  aom_codec_err_t local_8d4;
  AssertionResult local_8d0 [2];
  undefined4 local_8b0;
  aom_codec_err_t local_8ac;
  AssertionResult local_8a8 [2];
  undefined4 local_888;
  aom_codec_err_t local_884;
  AssertionResult local_880 [2];
  undefined4 local_860;
  aom_codec_err_t local_85c;
  AssertionResult local_858 [2];
  undefined4 local_838;
  aom_codec_err_t local_834;
  AssertionResult local_830 [2];
  undefined4 local_810;
  aom_codec_err_t local_80c;
  AssertionResult local_808 [2];
  undefined4 local_7e8;
  aom_codec_err_t local_7e4;
  AssertionResult local_7e0 [2];
  undefined4 local_7c0;
  aom_codec_err_t local_7bc;
  AssertionResult local_7b8 [2];
  undefined4 local_798;
  aom_codec_err_t local_794;
  AssertionResult local_790 [2];
  undefined4 local_770;
  aom_codec_err_t local_76c;
  AssertionResult local_768 [2];
  undefined4 local_748;
  aom_codec_err_t local_744;
  AssertionResult local_740 [2];
  undefined4 local_720;
  aom_codec_err_t local_71c;
  AssertionResult local_718 [2];
  undefined4 local_6f8;
  aom_codec_err_t local_6f4;
  AssertionResult local_6f0 [2];
  undefined4 local_6d0;
  aom_codec_err_t local_6cc;
  AssertionResult local_6c8 [2];
  undefined4 local_6a8;
  aom_codec_err_t local_6a4;
  AssertionResult local_6a0 [2];
  undefined4 local_680;
  aom_codec_err_t local_67c;
  AssertionResult local_678 [2];
  undefined4 local_658;
  aom_codec_err_t local_654;
  AssertionResult local_650 [2];
  undefined4 local_630;
  aom_codec_err_t local_62c;
  AssertionResult local_628 [2];
  undefined4 local_608;
  aom_codec_err_t local_604;
  AssertionResult local_600 [2];
  undefined4 local_5e0;
  aom_codec_err_t local_5dc;
  AssertionResult local_5d8 [2];
  undefined4 local_5b8;
  aom_codec_err_t local_5b4;
  AssertionResult local_5b0 [2];
  undefined4 local_590;
  aom_codec_err_t local_58c;
  AssertionResult local_588 [2];
  undefined4 local_568;
  aom_codec_err_t local_564;
  AssertionResult local_560 [2];
  undefined4 local_540;
  aom_codec_err_t local_53c;
  AssertionResult local_538 [2];
  undefined4 local_518;
  aom_codec_err_t local_514;
  AssertionResult local_510 [2];
  undefined4 local_4f0;
  aom_codec_err_t local_4ec;
  AssertionResult local_4e8 [2];
  undefined4 local_4c8;
  aom_codec_err_t local_4c4;
  AssertionResult local_4c0 [2];
  undefined4 local_4a0;
  aom_codec_err_t local_49c;
  AssertionResult local_498 [2];
  undefined4 local_478;
  aom_codec_err_t local_474;
  AssertionResult local_470 [2];
  undefined4 local_450;
  aom_codec_err_t local_44c;
  AssertionResult local_448 [2];
  undefined4 local_428;
  aom_codec_err_t local_424;
  AssertionResult local_420;
  uint local_40c;
  undefined4 local_3e8;
  aom_codec_err_t local_3e4;
  AssertionResult local_3e0;
  undefined4 local_3cc;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 local_370;
  undefined4 local_348;
  aom_codec_ctx_t local_48;
  aom_codec_iface_t *local_10;
  
  local_10 = aom_codec_av1_cx();
  local_3e4 = aom_codec_enc_config_default
                        (in_stack_fffffffffffff040,in_stack_fffffffffffff038,
                         (uint)((ulong)in_stack_fffffffffffff030 >> 0x20));
  local_3e8 = 0;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
             &in_stack_fffffffffffff038->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff030);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff060);
    testing::AssertionResult::failure_message((AssertionResult *)0x7fb8a7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff060,
               (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),(char *)in_stack_fffffffffffff050,
               (int)((ulong)in_stack_fffffffffffff048 >> 0x20),(char *)in_stack_fffffffffffff040);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
    testing::Message::~Message((Message *)0x7fb90a);
  }
  local_40c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fb991);
  if (local_40c == 0) {
    local_3c4 = 0xa00;
    local_3c0 = 0x640;
    local_348 = 0xe7;
    local_370 = 1;
    local_3cc = 8;
    local_424 = aom_codec_enc_init_ver
                          (in_stack_fffffffffffff060,(aom_codec_iface_t *)in_stack_fffffffffffff058,
                           in_stack_fffffffffffff050,(aom_codec_flags_t)in_stack_fffffffffffff048,
                           (int)((ulong)in_stack_fffffffffffff040 >> 0x20));
    local_428 = 0;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
               &in_stack_fffffffffffff038->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff030);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_420);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff060);
      testing::AssertionResult::failure_message((AssertionResult *)0x7fba84);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff060,
                 (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),(char *)in_stack_fffffffffffff050,
                 (int)((ulong)in_stack_fffffffffffff048 >> 0x20),(char *)in_stack_fffffffffffff040);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
      testing::Message::~Message((Message *)0x7fbae7);
    }
    local_40c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fbb6e);
    if (local_40c == 0) {
      local_44c = aom_codec_control(&local_48,0xd,0xb);
      local_450 = 0;
      testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                 &in_stack_fffffffffffff038->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff030);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff060);
        testing::AssertionResult::failure_message((AssertionResult *)0x7fbc1c);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff060,
                   (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                   (char *)in_stack_fffffffffffff050,(int)((ulong)in_stack_fffffffffffff048 >> 0x20)
                   ,(char *)in_stack_fffffffffffff040);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
        testing::Message::~Message((Message *)0x7fbc7f);
      }
      local_40c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fbd06);
      if (local_40c == 0) {
        local_474 = aom_codec_control(&local_48,0x3a,1);
        local_478 = 0;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                   &in_stack_fffffffffffff038->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff030)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_470);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff060);
          testing::AssertionResult::failure_message((AssertionResult *)0x7fbdb4);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff060,
                     (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                     (char *)in_stack_fffffffffffff050,
                     (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                     (char *)in_stack_fffffffffffff040);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
          testing::Message::~Message((Message *)0x7fbe17);
        }
        local_40c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fbe9e);
        if (local_40c == 0) {
          local_49c = aom_codec_control(&local_48,0x23,0);
          local_4a0 = 0;
          testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                    (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                     &in_stack_fffffffffffff038->g_usage,
                     (aom_codec_err_t *)in_stack_fffffffffffff030);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_498);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffff060);
            testing::AssertionResult::failure_message((AssertionResult *)0x7fbf49);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff060,
                       (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                       (char *)in_stack_fffffffffffff050,
                       (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                       (char *)in_stack_fffffffffffff040);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
            testing::Message::~Message((Message *)0x7fbfac);
          }
          local_40c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fc033);
          if (local_40c == 0) {
            local_4c4 = aom_codec_control(&local_48,0x6b,0);
            local_4c8 = 0;
            testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                      (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                       &in_stack_fffffffffffff038->g_usage,
                       (aom_codec_err_t *)in_stack_fffffffffffff030);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4c0);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffff060);
              testing::AssertionResult::failure_message((AssertionResult *)0x7fc0de);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff060,
                         (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                         (char *)in_stack_fffffffffffff050,
                         (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                         (char *)in_stack_fffffffffffff040);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
              testing::Message::~Message((Message *)0x7fc141);
            }
            local_40c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fc1c8);
            if (local_40c == 0) {
              local_4ec = aom_codec_control(&local_48,0x4f,0);
              local_4f0 = 0;
              testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                        (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                         &in_stack_fffffffffffff038->g_usage,
                         (aom_codec_err_t *)in_stack_fffffffffffff030);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4e8);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffff060);
                testing::AssertionResult::failure_message((AssertionResult *)0x7fc273);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff060,
                           (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                           (char *)in_stack_fffffffffffff050,
                           (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                           (char *)in_stack_fffffffffffff040);
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
                testing::Message::~Message((Message *)0x7fc2d6);
              }
              local_40c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fc35d);
              if (local_40c == 0) {
                local_514 = aom_codec_control(&local_48,0x28,3);
                local_518 = 0;
                testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                          (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                           &in_stack_fffffffffffff038->g_usage,
                           (aom_codec_err_t *)in_stack_fffffffffffff030);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_510);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffff060);
                  testing::AssertionResult::failure_message((AssertionResult *)0x7fc40b);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffff060,
                             (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                             (char *)in_stack_fffffffffffff050,
                             (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                             (char *)in_stack_fffffffffffff040);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
                  testing::Message::~Message((Message *)0x7fc46e);
                }
                local_40c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fc4f5);
                if (local_40c == 0) {
                  local_53c = aom_codec_control(&local_48,0x1a,300);
                  local_540 = 0;
                  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                            (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                             &in_stack_fffffffffffff038->g_usage,
                             (aom_codec_err_t *)in_stack_fffffffffffff030);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_538);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffff060);
                    testing::AssertionResult::failure_message((AssertionResult *)0x7fc5a3);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffff060,
                               (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                               (char *)in_stack_fffffffffffff050,
                               (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                               (char *)in_stack_fffffffffffff040);
                    testing::internal::AssertHelper::operator=
                              (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
                    testing::Message::~Message((Message *)0x7fc606);
                  }
                  local_40c = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fc68d);
                  if (local_40c == 0) {
                    local_564 = aom_codec_control(&local_48,0x7e,3);
                    local_568 = 0;
                    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                              (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                               &in_stack_fffffffffffff038->g_usage,
                               (aom_codec_err_t *)in_stack_fffffffffffff030);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_560);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_fffffffffffff060);
                      testing::AssertionResult::failure_message((AssertionResult *)0x7fc73b);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)in_stack_fffffffffffff060,
                                 (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                 (char *)in_stack_fffffffffffff050,
                                 (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                 (char *)in_stack_fffffffffffff040);
                      testing::internal::AssertHelper::operator=
                                (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
                      testing::Message::~Message((Message *)0x7fc79e);
                    }
                    local_40c = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fc825);
                    if (local_40c == 0) {
                      local_58c = aom_codec_control(&local_48,0x7f,3);
                      local_590 = 0;
                      testing::internal::EqHelper::
                      Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                                 &in_stack_fffffffffffff038->g_usage,
                                 (aom_codec_err_t *)in_stack_fffffffffffff030);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_588);
                      if (!bVar1) {
                        testing::Message::Message((Message *)in_stack_fffffffffffff060);
                        testing::AssertionResult::failure_message((AssertionResult *)0x7fc8d3);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)in_stack_fffffffffffff060,
                                   (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                   (char *)in_stack_fffffffffffff050,
                                   (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                   (char *)in_stack_fffffffffffff040);
                        testing::internal::AssertHelper::operator=
                                  (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
                        testing::Message::~Message((Message *)0x7fc936);
                      }
                      local_40c = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fc9bd);
                      if (local_40c == 0) {
                        local_5b4 = aom_codec_control(&local_48,0x80,3);
                        local_5b8 = 0;
                        testing::internal::EqHelper::
                        Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                  (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                                   &in_stack_fffffffffffff038->g_usage,
                                   (aom_codec_err_t *)in_stack_fffffffffffff030);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5b0);
                        if (!bVar1) {
                          testing::Message::Message((Message *)in_stack_fffffffffffff060);
                          testing::AssertionResult::failure_message((AssertionResult *)0x7fca6b);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)in_stack_fffffffffffff060,
                                     (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                     (char *)in_stack_fffffffffffff050,
                                     (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                     (char *)in_stack_fffffffffffff040);
                          testing::internal::AssertHelper::operator=
                                    (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff030);
                          testing::Message::~Message((Message *)0x7fcace);
                        }
                        local_40c = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fcb55);
                        if (local_40c == 0) {
                          local_5dc = aom_codec_control(&local_48,0x2b,1);
                          local_5e0 = 0;
                          testing::internal::EqHelper::
                          Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                    (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                                     &in_stack_fffffffffffff038->g_usage,
                                     (aom_codec_err_t *)in_stack_fffffffffffff030);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5d8);
                          if (!bVar1) {
                            testing::Message::Message((Message *)in_stack_fffffffffffff060);
                            testing::AssertionResult::failure_message((AssertionResult *)0x7fcc03);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)in_stack_fffffffffffff060,
                                       (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                       (char *)in_stack_fffffffffffff050,
                                       (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                       (char *)in_stack_fffffffffffff040);
                            testing::internal::AssertHelper::operator=
                                      (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                            testing::internal::AssertHelper::~AssertHelper
                                      (in_stack_fffffffffffff030);
                            testing::Message::~Message((Message *)0x7fcc66);
                          }
                          local_40c = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fcced);
                          if (local_40c == 0) {
                            local_604 = aom_codec_control(&local_48,0x68,1);
                            local_608 = 0;
                            testing::internal::EqHelper::
                            Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                      (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040,
                                       &in_stack_fffffffffffff038->g_usage,
                                       (aom_codec_err_t *)in_stack_fffffffffffff030);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_600);
                            if (!bVar1) {
                              testing::Message::Message((Message *)in_stack_fffffffffffff060);
                              testing::AssertionResult::failure_message((AssertionResult *)0x7fcd9b)
                              ;
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)in_stack_fffffffffffff060,
                                         (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                         (char *)in_stack_fffffffffffff050,
                                         (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                         (char *)in_stack_fffffffffffff040);
                              testing::internal::AssertHelper::operator=
                                        (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                              testing::internal::AssertHelper::~AssertHelper
                                        (in_stack_fffffffffffff030);
                              testing::Message::~Message((Message *)0x7fcdfe);
                            }
                            local_40c = (uint)!bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x7fce85);
                            if (local_40c == 0) {
                              local_62c = aom_codec_control(&local_48,0x22,1);
                              local_630 = 0;
                              testing::internal::EqHelper::
                              Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                        (in_stack_fffffffffffff048,(char *)in_stack_fffffffffffff040
                                         ,&in_stack_fffffffffffff038->g_usage,
                                         (aom_codec_err_t *)in_stack_fffffffffffff030);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_628);
                              if (!bVar1) {
                                testing::Message::Message((Message *)in_stack_fffffffffffff060);
                                testing::AssertionResult::failure_message
                                          ((AssertionResult *)0x7fcf33);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)in_stack_fffffffffffff060,
                                           (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                           (char *)in_stack_fffffffffffff050,
                                           (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                           (char *)in_stack_fffffffffffff040);
                                testing::internal::AssertHelper::operator=
                                          (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                                testing::internal::AssertHelper::~AssertHelper
                                          (in_stack_fffffffffffff030);
                                testing::Message::~Message((Message *)0x7fcf96);
                              }
                              local_40c = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x7fd01d);
                              if (local_40c == 0) {
                                local_654 = aom_codec_control(&local_48,0x21,2);
                                local_658 = 0;
                                testing::internal::EqHelper::
                                Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                          (in_stack_fffffffffffff048,
                                           (char *)in_stack_fffffffffffff040,
                                           &in_stack_fffffffffffff038->g_usage,
                                           (aom_codec_err_t *)in_stack_fffffffffffff030);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_650);
                                if (!bVar1) {
                                  testing::Message::Message((Message *)in_stack_fffffffffffff060);
                                  testing::AssertionResult::failure_message
                                            ((AssertionResult *)0x7fd0cb);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)in_stack_fffffffffffff060,
                                             (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                             (char *)in_stack_fffffffffffff050,
                                             (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                             (char *)in_stack_fffffffffffff040);
                                  testing::internal::AssertHelper::operator=
                                            (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            (in_stack_fffffffffffff030);
                                  testing::Message::~Message((Message *)0x7fd12e);
                                }
                                local_40c = (uint)!bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)0x7fd1b5);
                                if (local_40c == 0) {
                                  local_67c = aom_codec_control(&local_48,0x3d,0);
                                  local_680 = 0;
                                  testing::internal::EqHelper::
                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                            (in_stack_fffffffffffff048,
                                             (char *)in_stack_fffffffffffff040,
                                             &in_stack_fffffffffffff038->g_usage,
                                             (aom_codec_err_t *)in_stack_fffffffffffff030);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_678)
                                  ;
                                  if (!bVar1) {
                                    testing::Message::Message((Message *)in_stack_fffffffffffff060);
                                    testing::AssertionResult::failure_message
                                              ((AssertionResult *)0x7fd260);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)in_stack_fffffffffffff060,
                                               (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                               (char *)in_stack_fffffffffffff050,
                                               (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                               (char *)in_stack_fffffffffffff040);
                                    testing::internal::AssertHelper::operator=
                                              (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
                                    testing::internal::AssertHelper::~AssertHelper
                                              (in_stack_fffffffffffff030);
                                    testing::Message::~Message((Message *)0x7fd2c3);
                                  }
                                  local_40c = (uint)!bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)0x7fd34a);
                                  if (local_40c == 0) {
                                    local_6a4 = aom_codec_control(&local_48,0x2a,0);
                                    local_6a8 = 0;
                                    testing::internal::EqHelper::
                                    Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                              (in_stack_fffffffffffff048,
                                               (char *)in_stack_fffffffffffff040,
                                               &in_stack_fffffffffffff038->g_usage,
                                               (aom_codec_err_t *)in_stack_fffffffffffff030);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      (local_6a0);
                                    if (!bVar1) {
                                      testing::Message::Message
                                                ((Message *)in_stack_fffffffffffff060);
                                      testing::AssertionResult::failure_message
                                                ((AssertionResult *)0x7fd3f5);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)in_stack_fffffffffffff060,
                                                 (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                                 (char *)in_stack_fffffffffffff050,
                                                 (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                 (char *)in_stack_fffffffffffff040);
                                      testing::internal::AssertHelper::operator=
                                                (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8
                                                );
                                      testing::internal::AssertHelper::~AssertHelper
                                                (in_stack_fffffffffffff030);
                                      testing::Message::~Message((Message *)0x7fd458);
                                    }
                                    local_40c = (uint)!bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)0x7fd4df);
                                    if (local_40c == 0) {
                                      local_6cc = aom_codec_control(&local_48,0x60,0);
                                      local_6d0 = 0;
                                      testing::internal::EqHelper::
                                      Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                (in_stack_fffffffffffff048,
                                                 (char *)in_stack_fffffffffffff040,
                                                 &in_stack_fffffffffffff038->g_usage,
                                                 (aom_codec_err_t *)in_stack_fffffffffffff030);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        (local_6c8);
                                      if (!bVar1) {
                                        testing::Message::Message
                                                  ((Message *)in_stack_fffffffffffff060);
                                        testing::AssertionResult::failure_message
                                                  ((AssertionResult *)0x7fd58a);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)in_stack_fffffffffffff060,
                                                   (Type)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                                   (char *)in_stack_fffffffffffff050,
                                                   (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                   (char *)in_stack_fffffffffffff040);
                                        testing::internal::AssertHelper::operator=
                                                  (in_stack_fffffffffffff0b0,
                                                   in_stack_fffffffffffff0a8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  (in_stack_fffffffffffff030);
                                        testing::Message::~Message((Message *)0x7fd5ed);
                                      }
                                      local_40c = (uint)!bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)0x7fd674);
                                      if (local_40c == 0) {
                                        local_6f4 = aom_codec_control(&local_48,0x5f,0);
                                        local_6f8 = 0;
                                        testing::internal::EqHelper::
                                        Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                  (in_stack_fffffffffffff048,
                                                   (char *)in_stack_fffffffffffff040,
                                                   &in_stack_fffffffffffff038->g_usage,
                                                   (aom_codec_err_t *)in_stack_fffffffffffff030);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          (local_6f0);
                                        if (!bVar1) {
                                          testing::Message::Message
                                                    ((Message *)in_stack_fffffffffffff060);
                                          testing::AssertionResult::failure_message
                                                    ((AssertionResult *)0x7fd71f);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)in_stack_fffffffffffff060,
                                                     (Type)((ulong)in_stack_fffffffffffff058 >> 0x20
                                                           ),(char *)in_stack_fffffffffffff050,
                                                     (int)((ulong)in_stack_fffffffffffff048 >> 0x20)
                                                     ,(char *)in_stack_fffffffffffff040);
                                          testing::internal::AssertHelper::operator=
                                                    (in_stack_fffffffffffff0b0,
                                                     in_stack_fffffffffffff0a8);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    (in_stack_fffffffffffff030);
                                          testing::Message::~Message((Message *)0x7fd782);
                                        }
                                        local_40c = (uint)!bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)0x7fd809);
                                        if (local_40c == 0) {
                                          local_71c = aom_codec_control(&local_48,0x54,0);
                                          local_720 = 0;
                                          testing::internal::EqHelper::
                                          Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                    (in_stack_fffffffffffff048,
                                                     (char *)in_stack_fffffffffffff040,
                                                     &in_stack_fffffffffffff038->g_usage,
                                                     (aom_codec_err_t *)in_stack_fffffffffffff030);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            (local_718);
                                          if (!bVar1) {
                                            testing::Message::Message
                                                      ((Message *)in_stack_fffffffffffff060);
                                            testing::AssertionResult::failure_message
                                                      ((AssertionResult *)0x7fd8b4);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)in_stack_fffffffffffff060,
                                                       (Type)((ulong)in_stack_fffffffffffff058 >>
                                                             0x20),(char *)in_stack_fffffffffffff050
                                                       ,(int)((ulong)in_stack_fffffffffffff048 >>
                                                             0x20),(char *)in_stack_fffffffffffff040
                                                      );
                                            testing::internal::AssertHelper::operator=
                                                      (in_stack_fffffffffffff0b0,
                                                       in_stack_fffffffffffff0a8);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (in_stack_fffffffffffff030);
                                            testing::Message::~Message((Message *)0x7fd917);
                                          }
                                          local_40c = (uint)!bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)0x7fd99e);
                                          if (local_40c == 0) {
                                            local_744 = aom_codec_control(&local_48,0x38,2);
                                            local_748 = 0;
                                            testing::internal::EqHelper::
                                            Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                      (in_stack_fffffffffffff048,
                                                       (char *)in_stack_fffffffffffff040,
                                                       &in_stack_fffffffffffff038->g_usage,
                                                       (aom_codec_err_t *)in_stack_fffffffffffff030)
                                            ;
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              (local_740);
                                            if (!bVar1) {
                                              testing::Message::Message
                                                        ((Message *)in_stack_fffffffffffff060);
                                              testing::AssertionResult::failure_message
                                                        ((AssertionResult *)0x7fda4c);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)in_stack_fffffffffffff060,
                                                         (Type)((ulong)in_stack_fffffffffffff058 >>
                                                               0x20),
                                                         (char *)in_stack_fffffffffffff050,
                                                         (int)((ulong)in_stack_fffffffffffff048 >>
                                                              0x20),
                                                         (char *)in_stack_fffffffffffff040);
                                              testing::internal::AssertHelper::operator=
                                                        (in_stack_fffffffffffff0b0,
                                                         in_stack_fffffffffffff0a8);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (in_stack_fffffffffffff030);
                                              testing::Message::~Message((Message *)0x7fdaaf);
                                            }
                                            local_40c = (uint)!bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)0x7fdb36);
                                            if (local_40c == 0) {
                                              local_76c = aom_codec_control(&local_48,0x65,0);
                                              local_770 = 0;
                                              testing::internal::EqHelper::
                                              Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                        (in_stack_fffffffffffff048,
                                                         (char *)in_stack_fffffffffffff040,
                                                         &in_stack_fffffffffffff038->g_usage,
                                                         (aom_codec_err_t *)
                                                         in_stack_fffffffffffff030);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool(local_768);
                                              if (!bVar1) {
                                                testing::Message::Message
                                                          ((Message *)in_stack_fffffffffffff060);
                                                testing::AssertionResult::failure_message
                                                          ((AssertionResult *)0x7fdbe1);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)in_stack_fffffffffffff060
                                                           ,(Type)((ulong)in_stack_fffffffffffff058
                                                                  >> 0x20),
                                                           (char *)in_stack_fffffffffffff050,
                                                           (int)((ulong)in_stack_fffffffffffff048 >>
                                                                0x20),
                                                           (char *)in_stack_fffffffffffff040);
                                                testing::internal::AssertHelper::operator=
                                                          (in_stack_fffffffffffff0b0,
                                                           in_stack_fffffffffffff0a8);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (in_stack_fffffffffffff030);
                                                testing::Message::~Message((Message *)0x7fdc44);
                                              }
                                              local_40c = (uint)!bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)0x7fdccb);
                                              if (local_40c == 0) {
                                                local_794 = aom_codec_control(&local_48,99,0);
                                                local_798 = 0;
                                                testing::internal::EqHelper::
                                                Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                          (in_stack_fffffffffffff048,
                                                           (char *)in_stack_fffffffffffff040,
                                                           &in_stack_fffffffffffff038->g_usage,
                                                           (aom_codec_err_t *)
                                                           in_stack_fffffffffffff030);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool(local_790);
                                                if (!bVar1) {
                                                  testing::Message::Message
                                                            ((Message *)in_stack_fffffffffffff060);
                                                  testing::AssertionResult::failure_message
                                                            ((AssertionResult *)0x7fdd76);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff060,
                                                             (Type)((ulong)in_stack_fffffffffffff058
                                                                   >> 0x20),
                                                             (char *)in_stack_fffffffffffff050,
                                                             (int)((ulong)in_stack_fffffffffffff048
                                                                  >> 0x20),
                                                             (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fddd9);
                                                }
                                                local_40c = (uint)!bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)0x7fde60);
                                                if (local_40c == 0) {
                                                  local_7bc = aom_codec_control(&local_48,0x6a,0);
                                                  local_7c0 = 0;
                                                  testing::internal::EqHelper::
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_7b8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7fdf0b);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fdf6e);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7fdff5);
                                                  if (local_40c == 0) {
                                                    local_7e4 = aom_codec_control(&local_48,0x62,0);
                                                    local_7e8 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_7e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7fe0a0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fe103);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7fe18a);
                                                  if (local_40c == 0) {
                                                    local_80c = aom_codec_control(&local_48,0x79,1);
                                                    local_810 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_808);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7fe238);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fe29b);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7fe322);
                                                  if (local_40c == 0) {
                                                    local_834 = aom_codec_control(&local_48,0x3e,1);
                                                    local_838 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_830);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7fe3d0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fe433);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7fe4ba);
                                                  if (local_40c == 0) {
                                                    local_85c = aom_codec_control(&local_48,0x53,0);
                                                    local_860 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_858);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7fe565);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fe5c8);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7fe64f);
                                                  if (local_40c == 0) {
                                                    local_884 = aom_codec_control(&local_48,0x5c,0);
                                                    local_888 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_880);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7fe6fa);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fe75d);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7fe7e4);
                                                  if (local_40c == 0) {
                                                    local_8ac = aom_codec_control(&local_48,0x56,0);
                                                    local_8b0 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_8a8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7fe88f);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fe8f2);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7fe979);
                                                  if (local_40c == 0) {
                                                    local_8d4 = aom_codec_control(&local_48,0x5a,0);
                                                    local_8d8 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_8d0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7fea24);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fea87);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7feb0e);
                                                  if (local_40c == 0) {
                                                    local_8fc = aom_codec_control(&local_48,0x5e,0);
                                                    local_900 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_8f8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7febb9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fec1c);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7feca3);
                                                  if (local_40c == 0) {
                                                    local_924 = aom_codec_control(&local_48,0x4e,0);
                                                    local_928 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_920);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7fed4e);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fedb1);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7fee38);
                                                  if (local_40c == 0) {
                                                    local_94c = aom_codec_control(&local_48,0x69,0);
                                                    local_950 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_948);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff0b0 =
                                                         (AssertHelper *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x7feee3);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fef46);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7fefcd);
                                                  if (local_40c == 0) {
                                                    local_974 = aom_codec_control(&local_48,0x58,0);
                                                    local_978 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_970);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff0a8 =
                                                         (Message *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x7ff078);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7ff0db);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7ff162);
                                                  if (local_40c == 0) {
                                                    local_99c = aom_codec_control(&local_48,100,0);
                                                    local_9a0 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_998);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7ff20d);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7ff26a);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7ff2f1);
                                                  if (local_40c == 0) {
                                                    local_9c4 = aom_codec_control(&local_48,0x3f,0);
                                                    local_9c8 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_9c0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7ff39c);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7ff3f9);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7ff480);
                                                  if (local_40c == 0) {
                                                    local_9ec = aom_codec_control(&local_48,0x49,0);
                                                    local_9f0 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_9e8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7ff52b);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7ff588);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7ff60f);
                                                  if (local_40c == 0) {
                                                    local_a14 = aom_codec_control(&local_48,0x3b,0);
                                                    local_a18 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_a10);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7ff6ba);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7ff717);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7ff79e);
                                                  if (local_40c == 0) {
                                                    local_a3c = aom_codec_control(&local_48,0x5b,0);
                                                    local_a40 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_a38);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7ff849);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7ff8a6);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7ff92d);
                                                  if (local_40c == 0) {
                                                    local_a64 = aom_codec_control(&local_48,0x50,0);
                                                    local_a68 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_a60);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7ff9d8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7ffa35);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7ffabc);
                                                  if (local_40c == 0) {
                                                    local_a8c = aom_codec_control(&local_48,0x7c,3);
                                                    local_a90 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_a88);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7ffb6a);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7ffbc7);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7ffc4e);
                                                  if (local_40c == 0) {
                                                    local_ab4 = aom_codec_enc_config_set
                                                                          ((aom_codec_ctx_t *)
                                                                           in_stack_fffffffffffff040
                                                                           ,
                                                  in_stack_fffffffffffff038);
                                                  local_ab8 = 0;
                                                  testing::internal::EqHelper::
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_ab0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x7ffcf8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7ffd55);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x7ffddc);
                                                  if (local_40c == 0) {
                                                    memset(&local_c90,0,0x1c8);
                                                    local_c90 = 2;
                                                    local_c8c = 1;
                                                    local_c84 = 0x38;
                                                    local_c88 = 0x38;
                                                    local_c04 = 10;
                                                    local_c08 = 10;
                                                    local_b84 = 1;
                                                    local_b88 = 1;
                                                    local_b78 = 2;
                                                    local_b74 = 1;
                                                    local_b68 = local_348;
                                                    local_ae8 = 1;
                                                    local_ca4 = aom_codec_control(&local_48,0x84,
                                                                                  &local_c90);
                                                    local_ca8 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_ca0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff060 =
                                                         (aom_codec_ctx_t *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x7fff28);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x7fff85);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x80000c);
                                                  if (local_40c == 0) {
                                                    memset(local_cc0,0,8);
                                                    local_cd4 = aom_codec_control(&local_48,0x83,
                                                                                  local_cc0);
                                                    local_cd8 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_cd0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff058 =
                                                         (aom_image_t *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x8000d1);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x80012e);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x8001b5);
                                                  if (local_40c == 0) {
                                                    memset(local_d40,0,0x58);
                                                    local_d08 = 1;
                                                    local_d54 = aom_codec_control(&local_48,0x85,
                                                                                  local_d40);
                                                    local_d58 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_d50);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff050 =
                                                         (aom_codec_enc_cfg_t *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x800285);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x8002e2);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x800369);
                                                  if (local_40c == 0) {
                                                    local_d70 = CreateGrayImage((aom_img_fmt_t)
                                                                                ((ulong)
                                                  in_stack_fffffffffffff048 >> 0x20),
                                                  (uint)in_stack_fffffffffffff048,
                                                  (uint)((ulong)in_stack_fffffffffffff040 >> 0x20));
                                                  local_d88 = 0;
                                                  testing::internal::
                                                  CmpHelperNE<aom_image*,decltype(nullptr)>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             (aom_image **)in_stack_fffffffffffff038
                                                             ,&in_stack_fffffffffffff030->data_);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_d80);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff048 =
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x800418);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x800475);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x8004fc);
                                                  if (local_40c == 0) {
                                                    local_dac = aom_codec_encode(
                                                  in_stack_fffffffffffff060,
                                                  in_stack_fffffffffffff058,
                                                  (aom_codec_pts_t)in_stack_fffffffffffff050,
                                                  (unsigned_long)in_stack_fffffffffffff048,
                                                  (aom_enc_frame_flags_t)in_stack_fffffffffffff040);
                                                  local_db0 = 0;
                                                  testing::internal::EqHelper::
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_da8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff040 =
                                                         (aom_codec_iface_t *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x8005b3);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x800610);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x800697);
                                                  if (local_40c == 0) {
                                                    local_cc0[0] = 1;
                                                    local_dd4 = aom_codec_control(&local_48,0x83,
                                                                                  local_cc0);
                                                    local_dd8 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_dd0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff038 =
                                                         (aom_codec_enc_cfg_t *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x800753);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x8007b0);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x800837);
                                                  if (local_40c == 0) {
                                                    local_d08 = 0;
                                                    local_dfc = aom_codec_control(&local_48,0x85,
                                                                                  local_d40);
                                                    local_e00 = 0;
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_df8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff030 =
                                                         (AssertHelper *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x8008f3);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,
                                                               (Type)((ulong)
                                                  in_stack_fffffffffffff058 >> 0x20),
                                                  (char *)in_stack_fffffffffffff050,
                                                  (int)((ulong)in_stack_fffffffffffff048 >> 0x20),
                                                  (char *)in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x800950);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x8009d7);
                                                  if (local_40c == 0) {
                                                    aom_codec_encode(in_stack_fffffffffffff060,
                                                                     in_stack_fffffffffffff058,
                                                                     (aom_codec_pts_t)
                                                                     in_stack_fffffffffffff050,
                                                                     (unsigned_long)
                                                                     in_stack_fffffffffffff048,
                                                                     (aom_enc_frame_flags_t)
                                                                     in_stack_fffffffffffff040);
                                                    type = (Type)((ulong)in_stack_fffffffffffff058
                                                                 >> 0x20);
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                                                            (in_stack_fffffffffffff048,
                                                             (char *)in_stack_fffffffffffff040,
                                                             &in_stack_fffffffffffff038->g_usage,
                                                             (aom_codec_err_t *)
                                                             in_stack_fffffffffffff030);
                                                  line = (int)((ulong)in_stack_fffffffffffff048 >>
                                                              0x20);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_e20);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff060)
                                                    ;
                                                    in_stack_fffffffffffff028 =
                                                         (aom_codec_ctx_t *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x800a8e);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff060,type,
                                                               (char *)in_stack_fffffffffffff050,
                                                               line,(char *)
                                                  in_stack_fffffffffffff040);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff0b0,
                                                             in_stack_fffffffffffff0a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_fffffffffffff030);
                                                  testing::Message::~Message((Message *)0x800ae9);
                                                  }
                                                  local_40c = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x800b6d);
                                                  if (local_40c == 0) {
                                                    aom_img_free((aom_image_t *)0x800b89);
                                                    aom_codec_destroy(in_stack_fffffffffffff028);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(EncodeAPI, Buganizer339877165) {
  // Initialize libaom encoder.
  aom_codec_iface_t *const iface = aom_codec_av1_cx();
  aom_codec_ctx_t enc;
  aom_codec_enc_cfg_t cfg;

  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, AOM_USAGE_REALTIME),
            AOM_CODEC_OK);

  cfg.g_w = 2560;
  cfg.g_h = 1600;
  cfg.rc_target_bitrate = 231;
  cfg.rc_end_usage = AOM_CBR;
  cfg.g_threads = 8;

  ASSERT_EQ(aom_codec_enc_init(&enc, iface, &cfg, 0), AOM_CODEC_OK);

  // From libaom_av1_encoder.cc in WebRTC.
  ASSERT_EQ(aom_codec_control(&enc, AOME_SET_CPUUSED, 11), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_CDEF, 1), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_TPL_MODEL, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_DELTAQ_MODE, 0), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_ORDER_HINT, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_AQ_MODE, 3), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AOME_SET_MAX_INTRA_BITRATE_PCT, 300),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_COEFF_COST_UPD_FREQ, 3),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_MODE_COST_UPD_FREQ, 3),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_MV_COST_UPD_FREQ, 3),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_TUNE_CONTENT, AOM_CONTENT_SCREEN),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_PALETTE, 1), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_TILE_ROWS, 1), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_TILE_COLUMNS, 2), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_OBMC, 0), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_NOISE_SENSITIVITY, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_WARPED_MOTION, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_GLOBAL_MOTION, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_REF_FRAME_MVS, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_SUPERBLOCK_SIZE,
                              AOM_SUPERBLOCK_SIZE_DYNAMIC),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_CFL_INTRA, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_SMOOTH_INTRA, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_ANGLE_DELTA, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_FILTER_INTRA, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_INTRA_DEFAULT_TX_ONLY, 1),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_DISABLE_TRELLIS_QUANT, 1),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_DIST_WTD_COMP, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_DIFF_WTD_COMP, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_DUAL_FILTER, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_INTERINTRA_COMP, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_INTERINTRA_WEDGE, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_INTRA_EDGE_FILTER, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_INTRABC, 0), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_MASKED_COMP, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_PAETH_INTRA, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_QM, 0), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_RECT_PARTITIONS, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_RESTORATION, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_SMOOTH_INTERINTRA, 0),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_ENABLE_TX64, 0), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_MAX_REFERENCE_FRAMES, 3),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_enc_config_set(&enc, &cfg), AOM_CODEC_OK);

  aom_svc_params_t svc_params = {};
  svc_params.number_spatial_layers = 2;
  svc_params.number_temporal_layers = 1;
  svc_params.max_quantizers[0] = svc_params.max_quantizers[1] = 56;
  svc_params.min_quantizers[0] = svc_params.min_quantizers[1] = 10;
  svc_params.scaling_factor_num[0] = svc_params.scaling_factor_num[1] = 1;
  svc_params.scaling_factor_den[0] = 2;
  svc_params.scaling_factor_den[1] = 1;
  svc_params.layer_target_bitrate[0] = cfg.rc_target_bitrate;
  svc_params.framerate_factor[0] = 1;
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_SVC_PARAMS, &svc_params),
            AOM_CODEC_OK);

  aom_svc_layer_id_t layer_id = {};
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_SVC_LAYER_ID, &layer_id),
            AOM_CODEC_OK);

  aom_svc_ref_frame_config_t ref_frame_config = {};
  ref_frame_config.refresh[0] = 1;
  ASSERT_EQ(
      aom_codec_control(&enc, AV1E_SET_SVC_REF_FRAME_CONFIG, &ref_frame_config),
      AOM_CODEC_OK);

  // Create input image.
  aom_image_t *const image =
      CreateGrayImage(AOM_IMG_FMT_I420, cfg.g_w, cfg.g_h);
  ASSERT_NE(image, nullptr);

  // Encode layer 0.
  ASSERT_EQ(aom_codec_encode(&enc, image, 0, 1, 0), AOM_CODEC_OK);

  layer_id.spatial_layer_id = 1;
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_SVC_LAYER_ID, &layer_id),
            AOM_CODEC_OK);

  ref_frame_config.refresh[0] = 0;
  ASSERT_EQ(
      aom_codec_control(&enc, AV1E_SET_SVC_REF_FRAME_CONFIG, &ref_frame_config),
      AOM_CODEC_OK);

  // Encode layer 1.
  ASSERT_EQ(aom_codec_encode(&enc, image, 0, 1, 0), AOM_CODEC_OK);

  // Free resources.
  aom_img_free(image);
  aom_codec_destroy(&enc);
}